

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaRead.c
# Opt level: O0

void Pla_ReadAddBody(Pla_Man_t *p,Vec_Str_t *vLits)

{
  char cVar1;
  int iVar2;
  uint nSize;
  uint uVar3;
  word *p_00;
  word *p_01;
  int local_38;
  int nCubesReal;
  int Count;
  int Lit;
  int k;
  int i;
  word *pCubeOut;
  word *pCubeIn;
  Vec_Str_t *vLits_local;
  Pla_Man_t *p_local;
  
  local_38 = 0;
  iVar2 = Vec_StrSize(vLits);
  nSize = iVar2 / (p->nIns + p->nOuts);
  iVar2 = Vec_StrSize(vLits);
  if (iVar2 % (p->nIns + p->nOuts) != 0) {
    __assert_fail("Vec_StrSize(vLits) % (p->nIns + p->nOuts) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/pla/plaRead.c"
                  ,0xa2,"void Pla_ReadAddBody(Pla_Man_t *, Vec_Str_t *)");
  }
  uVar3 = Pla_ManCubeNum(p);
  if (nSize != uVar3) {
    uVar3 = Pla_ManCubeNum(p);
    printf("Warning: Declared number of cubes (%d) differs from the actual (%d).\n",(ulong)uVar3,
           (ulong)nSize);
    iVar2 = Pla_ManCubeNum(p);
    if ((int)nSize < iVar2) {
      Vec_IntShrink(&p->vCubes,nSize);
    }
    else {
      iVar2 = Pla_ManCubeNum(p);
      if ((int)nSize <= iVar2) {
        __assert_fail("nCubesReal > Pla_ManCubeNum(p)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/pla/plaRead.c"
                      ,0xab,"void Pla_ReadAddBody(Pla_Man_t *, Vec_Str_t *)");
      }
      Vec_IntFillNatural(&p->vCubes,nSize);
      Vec_WrdFillExtra(&p->vInBits,nSize * p->nInWords,0);
      Vec_WrdFillExtra(&p->vOutBits,nSize * p->nOutWords,0);
    }
  }
  for (Lit = 0; iVar2 = Pla_ManCubeNum(p), Lit < iVar2; Lit = Lit + 1) {
    p_00 = Pla_CubeIn(p,Lit);
    p_01 = Pla_CubeOut(p,Lit);
    for (Count = 0; Count < p->nIns; Count = Count + 1) {
      Pla_CubeGetLit(p_00,Count);
      cVar1 = Vec_StrEntry(vLits,local_38);
      Pla_CubeSetLit(p_00,Count,(int)cVar1);
      local_38 = local_38 + 1;
    }
    for (Count = 0; Count < p->nOuts; Count = Count + 1) {
      Pla_CubeGetLit(p_01,Count);
      cVar1 = Vec_StrEntry(vLits,local_38);
      Pla_CubeSetLit(p_01,Count,(int)cVar1);
      local_38 = local_38 + 1;
    }
  }
  iVar2 = Vec_StrSize(vLits);
  if (local_38 == iVar2) {
    return;
  }
  __assert_fail("Count == Vec_StrSize(vLits)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/pla/plaRead.c"
                ,0xb8,"void Pla_ReadAddBody(Pla_Man_t *, Vec_Str_t *)");
}

Assistant:

void Pla_ReadAddBody( Pla_Man_t * p, Vec_Str_t * vLits )
{
    word * pCubeIn, * pCubeOut; 
    int i, k, Lit, Count = 0; 
    int nCubesReal = Vec_StrSize(vLits) / (p->nIns + p->nOuts);
    assert( Vec_StrSize(vLits) % (p->nIns + p->nOuts) == 0 );
    if ( nCubesReal != Pla_ManCubeNum(p) )
    {
        printf( "Warning: Declared number of cubes (%d) differs from the actual (%d).\n", 
            Pla_ManCubeNum(p), nCubesReal );
        if ( nCubesReal < Pla_ManCubeNum(p) )
            Vec_IntShrink( &p->vCubes, nCubesReal );
        else
        {
            assert( nCubesReal > Pla_ManCubeNum(p) );
            Vec_IntFillNatural( &p->vCubes, nCubesReal );
            Vec_WrdFillExtra( &p->vInBits,  nCubesReal * p->nInWords,  0 );
            Vec_WrdFillExtra( &p->vOutBits, nCubesReal * p->nOutWords, 0 );
        }
    }
    Pla_ForEachCubeInOut( p, pCubeIn, pCubeOut, i )
    {
        Pla_CubeForEachLit( p->nIns, pCubeIn, Lit, k )
            Pla_CubeSetLit( pCubeIn, k, (Pla_Lit_t)Vec_StrEntry(vLits, Count++) );
        Pla_CubeForEachLit( p->nOuts, pCubeOut, Lit, k )
            Pla_CubeSetLit( pCubeOut, k, (Pla_Lit_t)Vec_StrEntry(vLits, Count++) );
    }
    assert( Count == Vec_StrSize(vLits) );
}